

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

Expression * __thiscall
wasm::anon_unknown_0::AsyncifyBuilder::makeStateCheck(AsyncifyBuilder *this,State value)

{
  Name name;
  GlobalGet *left;
  Const *right;
  Binary *pBVar1;
  Literal local_48;
  Type local_30;
  size_t local_28;
  char *pcStack_20;
  State local_14;
  AsyncifyBuilder *pAStack_10;
  State value_local;
  AsyncifyBuilder *this_local;
  
  local_28 = wasm::(anonymous_namespace)::ASYNCIFY_STATE;
  pcStack_20 = DAT_031935d8;
  local_14 = value;
  pAStack_10 = this;
  wasm::Type::Type(&local_30,i32);
  name.super_IString.str._M_str = pcStack_20;
  name.super_IString.str._M_len = local_28;
  left = Builder::makeGlobalGet(&this->super_Builder,name,local_30);
  wasm::Literal::Literal(&local_48,local_14);
  right = Builder::makeConst(&this->super_Builder,&local_48);
  pBVar1 = Builder::makeBinary(&this->super_Builder,EqInt32,(Expression *)left,(Expression *)right);
  wasm::Literal::~Literal(&local_48);
  return (Expression *)pBVar1;
}

Assistant:

Expression* makeStateCheck(State value) {
    return makeBinary(EqInt32,
                      makeGlobalGet(ASYNCIFY_STATE, Type::i32),
                      makeConst(Literal(int32_t(value))));
  }